

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.cpp
# Opt level: O0

void __thiscall OS_Socket_Mon_Thread::thread_main(OS_Socket_Mon_Thread *this)

{
  int iVar1;
  int *piVar2;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  int in_ESI;
  int __sig;
  OS_Event *in_RDI;
  pollfd fd [2];
  __pthread_cleanup_class __clframe;
  pollfd local_48;
  uint local_40;
  undefined2 local_3c;
  short local_3a;
  __pthread_cleanup_class local_20;
  
  iVar1 = pipe((int *)((in_RDI->cond).__size + 0x28));
  if (iVar1 == -1) {
    OS_CoreSocket::close(*(OS_CoreSocket **)((long)&in_RDI->cond + 0x20),in_ESI);
    OS_Event::signal(*(OS_Event **)(*(long *)((long)&in_RDI->cond + 0x20) + 0x28),in_ESI,__handler);
  }
  else {
    oss_debug_log("starting socket monitor thread %lx",*(undefined8 *)((long)&in_RDI->cond + 0x10));
    __pthread_cleanup_class::__pthread_cleanup_class(&local_20,thread_cleanup,in_RDI);
    while( true ) {
      OS_Waitable::wait((OS_Waitable *)
                        (*(long *)(*(long *)((long)&in_RDI->cond + 0x20) + 0x30) + 0x10),
                        (void *)0xffffffffffffffff);
      local_48.fd = *(int *)(*(long *)((long)&in_RDI->cond + 0x20) + 0x18);
      local_48.events = 0x14 - (ushort)(*(int *)(*(long *)((long)&in_RDI->cond + 0x20) + 0x20) == 0)
      ;
      local_40 = (in_RDI->cond).__data.__g_signals[0];
      local_3c = 1;
      __sig = 2;
      iVar1 = poll(&local_48,2,-1);
      if (((iVar1 < 0) && (piVar2 = __errno_location(), *piVar2 != 4)) || (local_3a != 0)) break;
      if (local_48.revents == 0) {
        OS_Event::reset(in_RDI);
        OS_Event::signal(*(OS_Event **)(*(long *)((long)&in_RDI->cond + 0x20) + 0x30),__sig,
                         __handler_01);
      }
      else {
        OS_Event::reset(in_RDI);
        OS_Event::signal(*(OS_Event **)(*(long *)((long)&in_RDI->cond + 0x20) + 0x28),__sig,
                         __handler_00);
      }
    }
    __pthread_cleanup_class::__setdoit(&local_20,1);
    __pthread_cleanup_class::~__pthread_cleanup_class((__pthread_cleanup_class *)in_RDI);
  }
  return;
}

Assistant:

void thread_main()
    {
        /* create the quit notifier pipe */
        if (pipe(qpipe) == -1)
        {
            s->close();
            s->ready_evt->signal();
            return;
        }

        /* 
         *   add a cleanup handler: on exit, we need to signal the 'ready'
         *   event so that any other threads waiting for the socket will
         *   unblock 
         */
        oss_debug_log("starting socket monitor thread %lx", (long)tid);
        pthread_cleanup_push(thread_cleanup, this);

        /* loop as long as the socket is open */
        for (;;)
        {
            /* 
             *   Wait for the socket to go into blocking mode.  Unix doesn't
             *   have an "inverse select" function that blocks while the
             *   handle is unblocked, so we have to roll our own mechanism
             *   here, using a separate event set up for this purpose.  The
             *   socket signals this event each time it encounters an
             *   EWOULDBLOCK error in a send/recv. 
             */
            s->blocked_evt->wait();

#if 1
            /* 
             *   Wait for the socket to become ready.  Also poll the quit
             *   notification pipe, so that we'll wake up as soon as our
             *   socket has been closed locally.  
             */
            pollfd fd[2];
            fd[0].fd = s->s;
            fd[0].events = (s->wouldblock_sending ? POLLOUT : POLLIN | POLLPRI)
                           | POLLHUP;
            fd[1].fd = qpipe[0];
            fd[1].events = POLLIN;

            /* wait; if that fails, terminate the thread */
            if (poll(fd, 2, -1) < 0)
            {
                if (errno != EINTR)
                    break;
            }

            /* check to see if the socket is ready, or if it's been closed */
            if (fd[1].revents != 0)
            {
                /* quit event - exit the loop */
                break;
            }
            else if (fd[0].revents != 0)
            {
                /* ready - reset the 'blocked' event, and signal 'ready' */
                s->blocked_evt->reset();
                s->ready_evt->signal();
            }
            else
            {
                /* not ready - reset 'ready' and signal 'blocked' */
                s->ready_evt->reset();
                s->blocked_evt->signal();
            }
#else
            /* initialize a selection set for the socket */
            fd_set rfds, wfds;
            FD_ZERO(&rfds);
            FD_ZERO(&wfds);

            /* add the socket to the appropriate sets */
            FD_SET(s->s, s->wouldblock_sending ? &wfds : &rfds);

            /* wait for the socket to become ready */
            if (select(s->s + 1, &rfds, &wfds, 0, 0) <= 0)
                break;

            /* 
             *   if the socket has an exception, give up - the socket must
             *   have been closed or reset, in which case the monitor thread
             *   is no longer useful
             */
            if (FD_ISSET(s->s, &efds))
                break;

            /* if the socket selector fired, the socket is ready */
            if (FD_ISSET(s->s, &rfds) || FD_ISSET(s->s, &wfds))
            {
                /* reset the 'blocked' event, and signal 'ready' */
                s->blocked_evt->reset();
                s->ready_evt->signal();
            }
            else
            {
                /* reset 'ready' and signal 'blocked' */
                s->ready_evt->reset();
                s->blocked_evt->signal();
            }
#endif
        }

        /* pop and invoke the cleanup handler */
        pthread_cleanup_pop(TRUE);
    }